

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

ptr<rpc_listener> __thiscall
nuraft::asio_service::create_rpc_listener(asio_service *this,ushort listening_port,ptr<logger> *l)

{
  io_context *__args_1;
  shared_ptr<nuraft::logger> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  ptr<rpc_listener> pVar1;
  undefined1 local_3b;
  ushort listening_port_local;
  _func_int **local_38;
  _func_int **pp_Stack_30;
  
  listening_port_local = (ushort)l;
  __args_1 = *(io_context **)(CONCAT62(in_register_00000032,listening_port) + 0x10);
  std::__shared_ptr<nuraft::asio_rpc_listener,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nuraft::asio_rpc_listener>,nuraft::asio_service_impl*&,asio::io_context&,asio::ssl::context&,unsigned_short&,bool&,std::shared_ptr<nuraft::logger>&>
            ((__shared_ptr<nuraft::asio_rpc_listener,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<nuraft::asio_rpc_listener> *)&local_3b,
             (asio_service_impl **)(CONCAT62(in_register_00000032,listening_port) + 0x10),__args_1,
             (context *)(__args_1 + 1),&listening_port_local,(bool *)(__args_1 + 0x1b),in_RCX);
  (this->super_delayed_task_scheduler)._vptr_delayed_task_scheduler = local_38;
  (this->super_rpc_client_factory)._vptr_rpc_client_factory = pp_Stack_30;
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<rpc_listener>)
         pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_listener> asio_service::create_rpc_listener( ushort listening_port,
                                                     ptr<logger>& l )
{
    try {
        return cs_new< asio_rpc_listener >
                     ( impl_,
                       impl_->io_svc_,
                       impl_->ssl_server_ctx_,
                       listening_port,
                       impl_->my_opt_.enable_ssl_,
                       l );
    } catch (std::exception& ee) {
        // Most likely exception happens due to wrong endpoint.
        p_er("got exception: %s", ee.what());
        return nullptr;
    }
}